

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O3

void rw::d3d9::defaultUninstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  short *psVar1;
  byte *pbVar2;
  ulong uVar3;
  uint8 *verts [2];
  VertexElement dcl [12];
  uint8 *local_b8 [4];
  ushort local_98 [2];
  byte abStack_94 [100];
  
  uVar3 = 0;
  local_b8[0] = d3d::lockVertices(header->vertexStream[0].vertexBuffer,0,0,0);
  local_b8[3] = local_b8[0];
  local_b8[1] = d3d::lockVertices(header->vertexStream[1].vertexBuffer,0,0,0);
  do {
    psVar1 = (short *)((long)header->vertexDeclaration + uVar3);
    uVar3 = uVar3 + 8;
  } while (*psVar1 != 0xff);
  local_b8[2] = local_b8[1];
  memcpy(local_98,header->vertexDeclaration,uVar3 & 0x7fffffff8);
  for (pbVar2 = abStack_94 + 3; (pbVar2[-1] != 0 || (*pbVar2 != 0)); pbVar2 = pbVar2 + 8) {
  }
  uninstV3d(*(int *)(d3d::vertFormatMap + (ulong)pbVar2[-3] * 4),geo->morphTargets->vertices,
            local_b8[*(ushort *)(pbVar2 + -7)] + *(ushort *)(pbVar2 + -5),header->totalNumVertex,
            header->vertexStream[*(ushort *)(pbVar2 + -7)].stride);
  if ((geo->flags & 8) != 0) {
    for (pbVar2 = abStack_94 + 3; (pbVar2[-1] != 10 || (*pbVar2 != 0)); pbVar2 = pbVar2 + 8) {
    }
    uninstColor(*(int *)(d3d::vertFormatMap + (ulong)pbVar2[-3] * 4),geo->colors,
                local_b8[*(ushort *)(pbVar2 + -7)] + *(ushort *)(pbVar2 + -5),header->totalNumVertex
                ,header->vertexStream[*(ushort *)(pbVar2 + -7)].stride);
  }
  if (0 < geo->numTexCoordSets) {
    uVar3 = 0;
    pbVar2 = abStack_94 + 3;
    do {
      for (; (pbVar2[-1] != 5 || (uVar3 != *pbVar2)); pbVar2 = pbVar2 + 8) {
      }
      uninstTexCoords(*(int *)(d3d::vertFormatMap + (ulong)pbVar2[-3] * 4),geo->texCoords[uVar3],
                      local_b8[*(ushort *)(pbVar2 + -7)] + *(ushort *)(pbVar2 + -5),
                      header->totalNumVertex,header->vertexStream[*(ushort *)(pbVar2 + -7)].stride);
      uVar3 = uVar3 + 1;
      pbVar2 = abStack_94 + 3;
    } while ((long)uVar3 < (long)geo->numTexCoordSets);
  }
  if ((geo->flags & 0x10) != 0) {
    for (pbVar2 = abStack_94 + 3; (pbVar2[-1] != 3 || (*pbVar2 != 0)); pbVar2 = pbVar2 + 8) {
    }
    uninstV3d(*(int *)(d3d::vertFormatMap + (ulong)pbVar2[-3] * 4),geo->morphTargets->normals,
              local_b8[*(ushort *)(pbVar2 + -7)] + *(ushort *)(pbVar2 + -5),header->totalNumVertex,
              header->vertexStream[*(ushort *)(pbVar2 + -7)].stride);
  }
  d3d::unlockVertices(local_b8[3]);
  d3d::unlockVertices(local_b8[2]);
  return;
}

Assistant:

void
defaultUninstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	VertexElement dcl[NUMDECLELT];

	uint8 *verts[2];
	verts[0] = lockVertices(header->vertexStream[0].vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	verts[1] = lockVertices(header->vertexStream[1].vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	getDeclaration(header->vertexDeclaration, dcl);

	int i;
	for(i = 0; dcl[i].usage != D3DDECLUSAGE_POSITION || dcl[i].usageIndex != 0; i++)
		;
	uninstV3d(vertFormatMap[dcl[i].type],
		  geo->morphTargets[0].vertices,
	          verts[dcl[i].stream] + dcl[i].offset,
		  header->totalNumVertex,
		  header->vertexStream[dcl[i].stream].stride);

	if(geo->flags & Geometry::PRELIT){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_COLOR || dcl[i].usageIndex != 0; i++)
			;
		uninstColor(vertFormatMap[dcl[i].type],
			    geo->colors,
		            verts[dcl[i].stream] + dcl[i].offset,
			    header->totalNumVertex,
			    header->vertexStream[dcl[i].stream].stride);
	}

	for(int32 n = 0; n < geo->numTexCoordSets; n++){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_TEXCOORD || dcl[i].usageIndex != n; i++)
			;
		uninstTexCoords(vertFormatMap[dcl[i].type],
			  geo->texCoords[n],
		          verts[dcl[i].stream] + dcl[i].offset,
			  header->totalNumVertex,
			  header->vertexStream[dcl[i].stream].stride);
	}

	if(geo->flags & Geometry::NORMALS){
		for(i = 0; dcl[i].usage != D3DDECLUSAGE_NORMAL || dcl[i].usageIndex != 0; i++)
			;
		uninstV3d(vertFormatMap[dcl[i].type],
			  geo->morphTargets[0].normals,
		          verts[dcl[i].stream] + dcl[i].offset,
			  header->totalNumVertex,
			  header->vertexStream[dcl[i].stream].stride);
	}

	unlockVertices(verts[0]);
	unlockVertices(verts[1]);
}